

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

void * KINCreate(SUNContext_conflict sunctx)

{
  undefined8 *__s;
  int line;
  char *msgfmt;
  
  if (sunctx == (SUNContext_conflict)0x0) {
    msgfmt = "sunctx = NULL illegal.";
    line = 0xdd;
  }
  else {
    __s = (undefined8 *)malloc(0x2b0);
    if (__s != (undefined8 *)0x0) {
      memset(__s,0,0x2b0);
      *__s = sunctx;
      __s[1] = 0x3cb0000000000000;
      __s[0x4b] = 0;
      __s[2] = 0;
      __s[3] = 0;
      __s[0x21] = 0;
      __s[0x22] = 0;
      __s[0x23] = 0;
      __s[0x24] = 0;
      __s[0x25] = 0;
      __s[0x26] = 0;
      __s[0x27] = 0;
      __s[0x28] = 0;
      __s[0x29] = 0;
      __s[0x2a] = 0;
      __s[0x2b] = 0;
      __s[0x2e] = 0;
      __s[0x2f] = 0;
      __s[0x30] = 0;
      __s[0x31] = 0;
      __s[0x32] = 0;
      __s[0x34] = 0;
      __s[0x35] = 0;
      __s[0x36] = 0;
      __s[0x40] = 0;
      __s[0x41] = 0;
      __s[0x2d] = 0x3ff0000000000000;
      *(undefined4 *)((long)__s + 0x164) = 0;
      *(undefined8 *)((long)__s + 0x1d4) = 0;
      *(undefined8 *)((long)__s + 0x1dc) = 0;
      __s[0x39] = 0;
      __s[0x3a] = 0;
      __s[0x37] = 0;
      __s[0x38] = 0;
      __s[0x3d] = 0;
      __s[0x3e] = 0;
      __s[0x33] = 0x3ff0000000000000;
      __s[0x3f] = 0;
      *(undefined4 *)(__s + 0x2c) = 0;
      __s[7] = 200;
      *(undefined4 *)(__s + 0x18) = 0;
      __s[8] = 10;
      *(undefined4 *)((long)__s + 0x6c) = 0;
      __s[9] = 5;
      *(undefined4 *)((long)__s + 0x74) = 0;
      __s[10] = 10;
      __s[0x19] = 0x4000000000000000;
      *(undefined8 *)((long)__s + 0x5c) = 0;
      *(undefined4 *)(__s + 0x10) = 0;
      *(undefined4 *)((long)__s + 0x84) = 0;
      *(undefined4 *)(__s + 0x11) = 0;
      *(undefined4 *)((long)__s + 0x8c) = 0x3e500000;
      __s[4] = 0x3ed965fea53d6e41;
      __s[5] = 0x3dc428a2f98d727c;
      *(undefined4 *)(__s + 0xb) = 1;
      __s[0x17] = 0x4000000000000000;
      __s[0x15] = 0x3fb999999999999a;
      __s[0x16] = 0x3feccccccccccccd;
      *(undefined4 *)(__s + 0x55) = 0;
      *(undefined4 *)(__s + 0x51) = 1;
      *(undefined4 *)(__s + 0x52) = 0;
      *(undefined4 *)((long)__s + 0x294) = 0;
      *(undefined4 *)(__s + 0x53) = 0x88e368f1;
      *(undefined4 *)((long)__s + 0x29c) = 0x3ee4f8b5;
      __s[0x54] = 0x3feccccccccccccd;
      __s[0x44] = 0x11;
      __s[0x45] = 0x16;
      __s[0x42] = 0;
      __s[0x43] = 0;
      return __s;
    }
    msgfmt = "A memory request failed.";
    line = 0xe5;
  }
  KINProcessError((KINMem)0x0,0,line,"KINCreate",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                  ,msgfmt);
  return (void *)0x0;
}

Assistant:

void* KINCreate(SUNContext sunctx)
{
  KINMem kin_mem;
  sunrealtype uround;

  /* Test inputs */
  if (sunctx == NULL)
  {
    KINProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSG_NULL_SUNCTX);
    return (NULL);
  }

  kin_mem = NULL;
  kin_mem = (KINMem)malloc(sizeof(struct KINMemRec));
  if (kin_mem == NULL)
  {
    KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
    return (NULL);
  }

  /* Zero out kin_mem */
  memset(kin_mem, 0, sizeof(struct KINMemRec));

  kin_mem->kin_sunctx = sunctx;

  /* set uround (unit roundoff) */

  kin_mem->kin_uround = uround = SUN_UNIT_ROUNDOFF;

  /* set default values for solver optional inputs */

  kin_mem->kin_func             = NULL;
  kin_mem->kin_user_data        = NULL;
  kin_mem->kin_uu               = NULL;
  kin_mem->kin_unew             = NULL;
  kin_mem->kin_fval             = NULL;
  kin_mem->kin_gval             = NULL;
  kin_mem->kin_uscale           = NULL;
  kin_mem->kin_fscale           = NULL;
  kin_mem->kin_pp               = NULL;
  kin_mem->kin_constraints      = NULL;
  kin_mem->kin_vtemp1           = NULL;
  kin_mem->kin_vtemp2           = NULL;
  kin_mem->kin_vtemp3           = NULL;
  kin_mem->kin_fold_aa          = NULL;
  kin_mem->kin_gold_aa          = NULL;
  kin_mem->kin_df_aa            = NULL;
  kin_mem->kin_dg_aa            = NULL;
  kin_mem->kin_q_aa             = NULL;
  kin_mem->kin_T_aa             = NULL;
  kin_mem->kin_gamma_aa         = NULL;
  kin_mem->kin_R_aa             = NULL;
  kin_mem->kin_cv               = NULL;
  kin_mem->kin_Xv               = NULL;
  kin_mem->kin_lmem             = NULL;
  kin_mem->kin_beta             = ONE;
  kin_mem->kin_damping          = SUNFALSE;
  kin_mem->kin_m_aa             = 0;
  kin_mem->kin_delay_aa         = 0;
  kin_mem->kin_current_depth    = 0;
  kin_mem->kin_damping_fn       = NULL;
  kin_mem->kin_depth_fn         = NULL;
  kin_mem->kin_orth_aa          = KIN_ORTH_MGS;
  kin_mem->kin_qr_func          = NULL;
  kin_mem->kin_qr_data          = NULL;
  kin_mem->kin_beta_aa          = ONE;
  kin_mem->kin_damping_aa       = SUNFALSE;
  kin_mem->kin_dot_prod_sb      = SUNFALSE;
  kin_mem->kin_constraintsSet   = SUNFALSE;
  kin_mem->kin_ret_newest       = SUNFALSE;
  kin_mem->kin_mxiter           = MXITER_DEFAULT;
  kin_mem->kin_noInitSetup      = SUNFALSE;
  kin_mem->kin_msbset           = MSBSET_DEFAULT;
  kin_mem->kin_noResMon         = SUNFALSE;
  kin_mem->kin_msbset_sub       = MSBSET_SUB_DEFAULT;
  kin_mem->kin_update_fnorm_sub = SUNFALSE;
  kin_mem->kin_mxnbcf           = MXNBCF_DEFAULT;
  kin_mem->kin_sthrsh           = TWO;
  kin_mem->kin_noMinEps         = SUNFALSE;
  kin_mem->kin_mxnstepin        = ZERO;
  kin_mem->kin_sqrt_relfunc     = SUNRsqrt(uround);
  kin_mem->kin_scsteptol        = SUNRpowerR(uround, TWOTHIRDS);
  kin_mem->kin_fnormtol         = SUNRpowerR(uround, ONETHIRD);
  kin_mem->kin_etaflag          = KIN_ETACHOICE1;
  kin_mem->kin_eta              = POINT1; /* default for KIN_ETACONSTANT */
  kin_mem->kin_eta_alpha        = TWO;    /* default for KIN_ETACHOICE2  */
  kin_mem->kin_eta_gamma        = POINT9; /* default for KIN_ETACHOICE2  */
  kin_mem->kin_MallocDone       = SUNFALSE;
  kin_mem->kin_eval_omega       = SUNTRUE;
  kin_mem->kin_omega            = ZERO; /* default to using min/max    */
  kin_mem->kin_omega_min        = OMEGA_MIN;
  kin_mem->kin_omega_max        = OMEGA_MAX;

  /* initialize lrw and liw */

  kin_mem->kin_lrw = 17;
  kin_mem->kin_liw = 22;

  /* NOTE: needed since KINInit could be called after KINSetConstraints */

  kin_mem->kin_lrw1 = 0;
  kin_mem->kin_liw1 = 0;

  return ((void*)kin_mem);
}